

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

void __thiscall
google::protobuf::DescriptorBuilder::BuildOneof
          (DescriptorBuilder *this,OneofDescriptorProto *proto,Descriptor *parent,
          OneofDescriptor *result)

{
  Symbol symbol;
  string *full_name;
  string *name;
  OneofOptions *orig_options;
  undefined4 uStack_34;
  
  full_name = DescriptorPool::Tables::AllocateString(this->tables_,*(string **)(parent + 8));
  std::__cxx11::string::append((ulong)full_name,'\x01');
  std::__cxx11::string::append((string *)full_name);
  ValidateSymbolName(this,(proto->name_).ptr_,full_name,&proto->super_Message);
  name = DescriptorPool::Tables::AllocateString(this->tables_,(proto->name_).ptr_);
  *(string **)result = name;
  *(string **)(result + 8) = full_name;
  *(Descriptor **)(result + 0x10) = parent;
  *(undefined4 *)(result + 0x1c) = 0;
  *(undefined8 *)(result + 0x20) = 0;
  if (((proto->_has_bits_).has_bits_[0] & 2) == 0) {
    *(undefined8 *)(result + 0x28) = 0;
  }
  else {
    orig_options = proto->options_;
    if (orig_options == (OneofOptions *)0x0) {
      orig_options = (OneofOptions *)&_OneofOptions_default_instance_;
    }
    AllocateOptions<google::protobuf::OneofDescriptor>(this,orig_options,result);
    name = *(string **)result;
    full_name = *(string **)(result + 8);
  }
  symbol._4_4_ = uStack_34;
  symbol.type = 3;
  symbol.field_1.oneof_descriptor = result;
  AddSymbol(this,full_name,parent,name,&proto->super_Message,symbol);
  return;
}

Assistant:

void DescriptorBuilder::BuildOneof(const OneofDescriptorProto& proto,
                                   Descriptor* parent,
                                   OneofDescriptor* result) {
  string* full_name = tables_->AllocateString(parent->full_name());
  full_name->append(1, '.');
  full_name->append(proto.name());

  ValidateSymbolName(proto.name(), *full_name, proto);

  result->name_ = tables_->AllocateString(proto.name());
  result->full_name_ = full_name;

  result->containing_type_ = parent;

  // We need to fill these in later.
  result->field_count_ = 0;
  result->fields_ = NULL;

  // Copy options.
  if (!proto.has_options()) {
    result->options_ = NULL;  // Will set to default_instance later.
  } else {
    AllocateOptions(proto.options(), result);
  }

  AddSymbol(result->full_name(), parent, result->name(),
            proto, Symbol(result));
}